

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  char local_128 [8];
  char error_buf [100];
  fd_set *__arr;
  undefined1 local_b0 [4];
  uint __i;
  fd_set read_fds;
  mbedtls_net_context local_28;
  int nb_fds;
  mbedtls_net_context server_fd;
  mbedtls_net_context client_fd;
  mbedtls_net_context listen_fd;
  int ret;
  char **argv_local;
  int argc_local;
  
  mbedtls_net_init(&server_fd);
  mbedtls_net_init((mbedtls_net_context *)&nb_fds);
  mbedtls_net_init(&local_28);
  get_options(argc,argv);
  if (opt.seed == 0) {
    uVar2 = time((time_t *)0x0);
    opt.seed = (uint)uVar2;
    printf("  . Pseudo-random seed: %u\n",uVar2 & 0xffffffff);
  }
  srand(opt.seed);
  printf("  . Connect to server on UDP/%s/%s ...",opt.server_addr,opt.server_port);
  fflush(_stdout);
  client_fd.fd = mbedtls_net_connect(&local_28,opt.server_addr,opt.server_port,1);
  if (client_fd.fd == 0) {
    printf(" ok\n");
    printf("  . Bind on UDP/%s/%s ...",opt.listen_addr,opt.listen_port);
    fflush(_stdout);
    client_fd.fd = mbedtls_net_bind(&server_fd,opt.listen_addr,opt.listen_port,1);
    if (client_fd.fd == 0) {
      printf(" ok\n");
      while( true ) {
        mbedtls_net_free((mbedtls_net_context *)&nb_fds);
        printf("  . Waiting for a remote connection ...");
        fflush(_stdout);
        client_fd.fd = mbedtls_net_accept(&server_fd,(mbedtls_net_context *)&nb_fds,(void *)0x0,0,
                                          (size_t *)0x0);
        if (client_fd.fd != 0) break;
        printf(" ok\n");
        clear_pending();
        memset(dropped,0,0x800);
        read_fds.__fds_bits[0xf]._4_4_ = nb_fds;
        if (nb_fds < local_28.fd) {
          read_fds.__fds_bits[0xf]._4_4_ = local_28.fd;
        }
        if (read_fds.__fds_bits[0xf]._4_4_ < server_fd.fd) {
          read_fds.__fds_bits[0xf]._4_4_ = server_fd.fd;
        }
        read_fds.__fds_bits[0xf]._4_4_ = read_fds.__fds_bits[0xf]._4_4_ + 1;
        do {
          unique0x00004880 = local_b0;
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            *(undefined8 *)(unique0x00004880 + (ulong)__arr._4_4_ * 8) = 0;
          }
          *(ulong *)(local_b0 + (long)(local_28.fd / 0x40) * 8) =
               1L << ((byte)((long)local_28.fd % 0x40) & 0x3f) |
               *(ulong *)(local_b0 + (long)(local_28.fd / 0x40) * 8);
          *(ulong *)(local_b0 + (long)(nb_fds / 0x40) * 8) =
               1L << ((byte)((long)nb_fds % 0x40) & 0x3f) |
               *(ulong *)(local_b0 + (long)(nb_fds / 0x40) * 8);
          *(ulong *)(local_b0 + (long)(server_fd.fd / 0x40) * 8) =
               1L << ((byte)((long)server_fd.fd % 0x40) & 0x3f) |
               *(ulong *)(local_b0 + (long)(server_fd.fd / 0x40) * 8);
          client_fd.fd = select(read_fds.__fds_bits[0xf]._4_4_,(fd_set *)local_b0,(fd_set *)0x0,
                                (fd_set *)0x0,(timeval *)0x0);
          if (client_fd.fd < 1) {
            perror("select");
            goto LAB_00102fec;
          }
        } while ((((*(ulong *)(local_b0 + (long)(server_fd.fd / 0x40) * 8) &
                   1L << ((byte)((long)server_fd.fd % 0x40) & 0x3f)) == 0) &&
                 (((*(ulong *)(local_b0 + (long)(nb_fds / 0x40) * 8) &
                   1L << ((byte)((long)nb_fds % 0x40) & 0x3f)) == 0 ||
                  (iVar1 = handle_message("S <- C",&local_28,(mbedtls_net_context *)&nb_fds),
                  iVar1 == 0)))) &&
                (((*(ulong *)(local_b0 + (long)(local_28.fd / 0x40) * 8) &
                  1L << ((byte)((long)local_28.fd % 0x40) & 0x3f)) == 0 ||
                 (iVar1 = handle_message("S -> C",(mbedtls_net_context *)&nb_fds,&local_28),
                 iVar1 == 0))));
      }
      printf(" failed\n  ! mbedtls_net_accept returned %d\n\n",(ulong)(uint)client_fd.fd);
    }
    else {
      printf(" failed\n  ! mbedtls_net_bind returned %d\n\n",(ulong)(uint)client_fd.fd);
    }
  }
  else {
    printf(" failed\n  ! mbedtls_net_connect returned %d\n\n",(ulong)(uint)client_fd.fd);
  }
LAB_00102fec:
  if (client_fd.fd != 0) {
    mbedtls_strerror(client_fd.fd,local_128,100);
    printf("Last error was: -0x%04X - %s\n\n",(ulong)(uint)-client_fd.fd,local_128);
    fflush(_stdout);
  }
  mbedtls_net_free((mbedtls_net_context *)&nb_fds);
  mbedtls_net_free(&local_28);
  mbedtls_net_free(&server_fd);
  return (int)(client_fd.fd != 0);
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret;

    mbedtls_net_context listen_fd, client_fd, server_fd;

    int nb_fds;
    fd_set read_fds;

    mbedtls_net_init( &listen_fd );
    mbedtls_net_init( &client_fd );
    mbedtls_net_init( &server_fd );

    get_options( argc, argv );

    /*
     * Decisions to drop/delay/duplicate packets are pseudo-random: dropping
     * exactly 1 in N packets would lead to problems when a flight has exactly
     * N packets: the same packet would be dropped on every resend.
     *
     * In order to be able to reproduce problems reliably, the seed may be
     * specified explicitly.
     */
    if( opt.seed == 0 )
    {
        opt.seed = (unsigned int) time( NULL );
        mbedtls_printf( "  . Pseudo-random seed: %u\n", opt.seed );
    }

    srand( opt.seed );

    /*
     * 0. "Connect" to the server
     */
    mbedtls_printf( "  . Connect to server on UDP/%s/%s ...",
            opt.server_addr, opt.server_port );
    fflush( stdout );

    if( ( ret = mbedtls_net_connect( &server_fd, opt.server_addr, opt.server_port,
                             MBEDTLS_NET_PROTO_UDP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_connect returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1. Setup the "listening" UDP socket
     */
    mbedtls_printf( "  . Bind on UDP/%s/%s ...",
            opt.listen_addr, opt.listen_port );
    fflush( stdout );

    if( ( ret = mbedtls_net_bind( &listen_fd, opt.listen_addr, opt.listen_port,
                          MBEDTLS_NET_PROTO_UDP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_bind returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 2. Wait until a client connects
     */
accept:
    mbedtls_net_free( &client_fd );

    mbedtls_printf( "  . Waiting for a remote connection ..." );
    fflush( stdout );

    if( ( ret = mbedtls_net_accept( &listen_fd, &client_fd,
                                    NULL, 0, NULL ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_accept returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 3. Forward packets forever (kill the process to terminate it)
     */
    clear_pending();
    memset( dropped, 0, sizeof( dropped ) );

    nb_fds = client_fd.fd;
    if( nb_fds < server_fd.fd )
        nb_fds = server_fd.fd;
    if( nb_fds < listen_fd.fd )
        nb_fds = listen_fd.fd;
    ++nb_fds;

    while( 1 )
    {
        FD_ZERO( &read_fds );
        FD_SET( server_fd.fd, &read_fds );
        FD_SET( client_fd.fd, &read_fds );
        FD_SET( listen_fd.fd, &read_fds );

        if( ( ret = select( nb_fds, &read_fds, NULL, NULL, NULL ) ) <= 0 )
        {
            perror( "select" );
            goto exit;
        }

        if( FD_ISSET( listen_fd.fd, &read_fds ) )
            goto accept;

        if( FD_ISSET( client_fd.fd, &read_fds ) )
        {
            if( ( ret = handle_message( "S <- C",
                                        &server_fd, &client_fd ) ) != 0 )
                goto accept;
        }

        if( FD_ISSET( server_fd.fd, &read_fds ) )
        {
            if( ( ret = handle_message( "S -> C",
                                        &client_fd, &server_fd ) ) != 0 )
                goto accept;
        }
    }

exit:

#ifdef MBEDTLS_ERROR_C
    if( ret != 0 )
    {
        char error_buf[100];
        mbedtls_strerror( ret, error_buf, 100 );
        mbedtls_printf( "Last error was: -0x%04X - %s\n\n", - ret, error_buf );
        fflush( stdout );
    }
#endif

    mbedtls_net_free( &client_fd );
    mbedtls_net_free( &server_fd );
    mbedtls_net_free( &listen_fd );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret != 0 );
}